

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O1

void d_dac_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("dac~");
  dac_class = class_new(ptVar1,dac_new,dac_free,0x48,0,A_GIMME,0);
  class_domainsignalin(dac_class,0x40);
  p_Var2 = dac_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,dac_dsp,ptVar1,A_CANT);
  p_Var2 = dac_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,dac_set,ptVar1,A_GIMME);
  p_Var2 = dac_class;
  ptVar1 = gensym("adc~_dac~");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("adc~");
  p_Var2 = class_new(ptVar1,adc_new,adc_free,0x40,0,A_GIMME,0);
  adc_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,adc_dsp,ptVar1,A_CANT,0);
  p_Var2 = adc_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,adc_set,ptVar1,A_GIMME,0);
  p_Var2 = adc_class;
  ptVar1 = gensym("adc~_dac~");
  class_sethelpsymbol(p_Var2,ptVar1);
  return;
}

Assistant:

static void dac_setup(void)
{
    dac_class = class_new(gensym("dac~"), (t_newmethod)dac_new,
        (t_method)dac_free, sizeof(t_dac), 0, A_GIMME, 0);
    CLASS_MAINSIGNALIN(dac_class, t_dac, x_f);
    class_addmethod(dac_class, (t_method)dac_dsp, gensym("dsp"), A_CANT, 0);
    class_addmethod(dac_class, (t_method)dac_set, gensym("set"), A_GIMME, 0);
    class_sethelpsymbol(dac_class, gensym("adc~_dac~"));
}